

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.cpp
# Opt level: O1

void __thiscall LoaderLogger::RemoveLogRecorder(LoaderLogger *this,uint64_t unique_id)

{
  iterator __last;
  LoaderLogRecorder *pLVar1;
  LoaderLogRecorder *pLVar2;
  _Hash_node_base *p_Var3;
  uint64_t uVar4;
  pointer __p;
  unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *puVar5;
  size_type sVar6;
  long lVar7;
  unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *puVar8;
  iterator __first;
  unique_lock<std::shared_timed_mutex> lock;
  uint64_t local_48;
  unique_lock<std::shared_timed_mutex> local_40;
  
  local_40._M_owns = false;
  local_48 = unique_id;
  local_40._M_device = &this->_mutex;
  std::unique_lock<std::shared_timed_mutex>::lock(&local_40);
  uVar4 = local_48;
  local_40._M_owns = true;
  puVar8 = (this->_recorders).
           super__Vector_base<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->_recorders).
       super__Vector_base<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)__last._M_current - (long)puVar8 >> 5;
  puVar5 = puVar8;
  if (0 < lVar7) {
    puVar5 = (unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
             ((long)&(puVar8->_M_t).
                     super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>
                     .super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl +
             ((long)__last._M_current - (long)puVar8 & 0xffffffffffffffe0U));
    lVar7 = lVar7 + 1;
    __first._M_current = puVar8 + 2;
    do {
      if ((__first._M_current[-2]._M_t.
           super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
           super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
           super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id == local_48)
      {
        __first._M_current = __first._M_current + -2;
        goto LAB_00112e4a;
      }
      if ((__first._M_current[-1]._M_t.
           super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
           super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
           super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id == local_48)
      {
        __first._M_current = __first._M_current + -1;
        goto LAB_00112e4a;
      }
      if ((((__first._M_current)->_M_t).
           super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
           super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
           super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id == local_48)
      goto LAB_00112e4a;
      if ((__first._M_current[1]._M_t.
           super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
           super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
           super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id == local_48)
      {
        __first._M_current = __first._M_current + 1;
        goto LAB_00112e4a;
      }
      lVar7 = lVar7 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)__last._M_current - (long)puVar5 >> 3;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      __first._M_current = __last._M_current;
      if ((lVar7 != 3) ||
         (__first._M_current = puVar5,
         ((puVar5->_M_t).
          super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
          super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
          super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id == local_48))
      goto LAB_00112e4a;
      puVar5 = puVar5 + 1;
    }
    __first._M_current = puVar5;
    if (((puVar5->_M_t).
         super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
         super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
         super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id == local_48)
    goto LAB_00112e4a;
    puVar5 = puVar5 + 1;
  }
  __first._M_current = puVar5;
  if (((puVar5->_M_t).
       super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
       super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
       super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id != local_48) {
    __first._M_current = __last._M_current;
  }
LAB_00112e4a:
  puVar8 = __first._M_current + 1;
  if (puVar8 != __last._M_current && __first._M_current != __last._M_current) {
    do {
      pLVar1 = (puVar8->_M_t).
               super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>.
               _M_t.
               super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
               super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl;
      if (pLVar1->_unique_id != uVar4) {
        (puVar8->_M_t).
        super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
        super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
        super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl = (LoaderLogRecorder *)0x0;
        pLVar2 = ((__first._M_current)->_M_t).
                 super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>
                 .super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl;
        ((__first._M_current)->_M_t).
        super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
        super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
        super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl = pLVar1;
        if (pLVar2 != (LoaderLogRecorder *)0x0) {
          (*pLVar2->_vptr_LoaderLogRecorder[1])();
        }
        __first._M_current = __first._M_current + 1;
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != __last._M_current);
  }
  std::
  vector<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
  ::_M_erase(&this->_recorders,__first,__last);
  for (p_Var3 = (this->_recordersByInstance)._M_h._M_before_begin._M_nxt;
      p_Var3 != (_Hash_node_base *)0x0; p_Var3 = p_Var3->_M_nxt) {
    sVar6 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)(p_Var3 + 2),&local_48);
    if (sVar6 != 0) {
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)(p_Var3 + 2),&local_48);
    }
  }
  std::unique_lock<std::shared_timed_mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void LoaderLogger::RemoveLogRecorder(uint64_t unique_id) {
    std::unique_lock<std::shared_timed_mutex> lock(_mutex);
    vector_remove_if_and_erase(
        _recorders, [=](std::unique_ptr<LoaderLogRecorder> const& recorder) { return recorder->UniqueId() == unique_id; });
    for (auto& recorders : _recordersByInstance) {
        auto& messengersForInstance = recorders.second;
        if (messengersForInstance.count(unique_id) > 0) {
            messengersForInstance.erase(unique_id);
        }
    }
}